

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  _Alloc_hider __s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  ostream *poVar10;
  undefined8 uVar11;
  size_type sVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  int local_5c;
  string local_58;
  int local_34;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_100,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       ,0x464);
    Message::Message((Message *)&local_120);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10),
               "Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10),
               " in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10),"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10)," ",1);
    poVar10 = (ostream *)(local_120._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      lVar7 = 0x26;
      pcVar9 = "couldn\'t detect the number of threads.";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_120._M_dataplus._M_p + 0x10));
      poVar10 = (ostream *)(local_120._M_dataplus._M_p + 0x10);
      lVar7 = 9;
      pcVar9 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar9,lVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10),
               " See https://github.com/google/googletest/blob/master/docs/advanced.md#death-tests-and-threads"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10),
               " for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_120._M_dataplus._M_p + 0x10),
               " this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_e0,(stringstream *)local_120._M_dataplus._M_p);
    if ((stringstream *)local_120._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_e0._M_dataplus._M_p,local_e0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_100);
  }
  iVar1 = pipe(&local_60);
  if (iVar1 == -1) {
    paVar15 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CHECK failed: File ","");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_80,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       );
    paVar16 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar13 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar13) {
      local_c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_c0._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_c0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_c0._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_c0,", line ");
    paVar13 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar14 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == paVar14) {
      local_140.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_140._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_140._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p._0_4_ = 0x468;
    StreamableToString<int>(&local_a0,(int *)&local_58);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar13) {
      uVar11 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_a0._M_string_length + local_140._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar11 = local_a0.field_2._M_allocated_capacity;
      }
      __s._M_p = local_140._M_dataplus._M_p;
      sVar12 = local_140._M_string_length;
      if (local_a0._M_string_length + local_140._M_string_length <= (ulong)uVar11)
      goto LAB_0013fc1d;
    }
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_140,local_a0._M_dataplus._M_p,local_a0._M_string_length);
LAB_0013fc2e:
    local_100._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar14 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar14) {
      local_100.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_100._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar5->_M_string_length = 0;
    paVar14->_M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_100,": ");
    paVar14 = &local_120.field_2;
    local_120._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == paVar8) {
      local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_120._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_120.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_120._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_120,"pipe(pipe_fd) != -1");
    paVar8 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar6) {
      local_e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_e0._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort(&local_e0);
    pbVar5 = extraout_RAX_00;
    local_e0._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    paVar15 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DeathTest::last_death_test_message__abi_cxx11_,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar15) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var2;
      if (_Var2 == 0) {
        do {
          iVar1 = close(local_60);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_5c;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_a0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       );
        local_80._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == paVar16) {
          local_80.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_80._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_80,", line ");
        local_c0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == paVar16) {
          local_c0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_c0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_34 = 0x479;
        StreamableToString<int>(&local_58,&local_34);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          uVar11 = local_c0.field_2._M_allocated_capacity;
        }
        sVar12 = local_c0._M_string_length;
        if ((ulong)uVar11 < local_58._M_string_length + local_c0._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
              &local_58.field_2) {
            uVar11 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_58._M_string_length + local_c0._M_string_length)
          goto LAB_0013f705;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_58,0,0,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        }
        else {
LAB_0013f705:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_c0,
                             (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                              local_58._M_dataplus._M_p._0_4_),
                             local_58._M_string_length);
        }
        local_140._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p == paVar16) {
          local_140.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        }
        else {
          local_140.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_140._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        paVar16->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_140,": ");
        local_100._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar16) {
          local_100.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_100._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_100,"close(pipe_fd[0])");
        local_120._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p == paVar16) {
          local_120.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_120._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_120," != -1");
        local_e0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        __s._M_p = (pointer)&pbVar5->field_2;
        if (local_e0._M_dataplus._M_p != __s._M_p) goto LAB_0013fbef;
        local_e0.field_2._M_allocated_capacity = *(undefined8 *)__s._M_p;
        local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_e0._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        do {
          iVar1 = close(local_5c);
          if (iVar1 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_60;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_a0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       );
        local_80._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == paVar16) {
          local_80.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        }
        else {
          local_80.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_80._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_80,", line ");
        local_c0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == paVar16) {
          local_c0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_c0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        local_34 = 0x485;
        StreamableToString<int>(&local_58,&local_34);
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          uVar11 = local_c0.field_2._M_allocated_capacity;
        }
        sVar12 = local_c0._M_string_length;
        if ((ulong)uVar11 < local_58._M_string_length + local_c0._M_string_length) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
              &local_58.field_2) {
            uVar11 = local_58.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_58._M_string_length + local_c0._M_string_length)
          goto LAB_0013f57e;
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_58,0,0,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        }
        else {
LAB_0013f57e:
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_c0,
                             (char *)CONCAT44(local_58._M_dataplus._M_p._4_4_,
                                              local_58._M_dataplus._M_p._0_4_),
                             local_58._M_string_length);
        }
        local_140._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p == paVar16) {
          local_140.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        }
        else {
          local_140.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_140._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        paVar16->_M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_140,": ");
        local_100._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p == paVar16) {
          local_100.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_100._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_100,"close(pipe_fd[1])");
        local_120._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        paVar16 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p == paVar16) {
          local_120.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        }
        else {
          local_120.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        }
        local_120._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_120," != -1");
        local_e0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
        __s._M_p = (pointer)&pbVar5->field_2;
        if (local_e0._M_dataplus._M_p == __s._M_p) {
          local_e0.field_2._M_allocated_capacity = *(undefined8 *)__s._M_p;
          local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          local_e0._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *(undefined8 *)__s._M_p;
        }
        local_e0._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = __s._M_p;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        DeathTestAbort(&local_e0);
        pbVar5 = extraout_RAX;
        local_e0._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0013fbef:
        local_e0.field_2._M_allocated_capacity = *(undefined8 *)__s._M_p;
      }
      paVar16 = &local_a0.field_2;
      paVar13 = &local_80.field_2;
      local_e0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = __s._M_p;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_e0);
LAB_0013fc1d:
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_a0,0,0,__s._M_p,sVar12);
      goto LAB_0013fc2e;
    }
    paVar16 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"CHECK failed: File ","");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_80,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       );
    paVar13 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar14 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar14) {
      local_c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_c0._M_dataplus._M_p = (pointer)paVar13;
    }
    else {
      local_c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_c0._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_c0,", line ");
    paVar14 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == paVar8) {
      local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_140.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_140._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_140.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_140._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p._0_4_ = 0x476;
    StreamableToString<int>(&local_a0,(int *)&local_58);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar14) {
      uVar11 = local_140.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_a0._M_string_length + local_140._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar11 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_a0._M_string_length + local_140._M_string_length) goto LAB_0013fb60;
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_a0,0,0,local_140._M_dataplus._M_p,local_140._M_string_length);
    }
    else {
LAB_0013fb60:
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_140,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    }
    local_100._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar8 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar8) {
      local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_100.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    }
    else {
      local_100.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_100._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar5->_M_string_length = 0;
    paVar8->_M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_100,": ");
    paVar8 = &local_120.field_2;
    local_120._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == paVar6) {
      local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_120._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_120._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_120,"child_pid != -1");
    local_e0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar6) {
      local_e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar15;
      goto LAB_0013fe1c;
    }
  }
  local_e0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
LAB_0013fe1c:
  local_e0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar15) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar8) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar14) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar13) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar16) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}